

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::rp_basis(HModel *this)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  int var;
  ulong uVar4;
  
  printf("\nReporting current basis: numCol = %d; numRow = %d\n",(ulong)(uint)this->numCol,
         (ulong)(uint)this->numRow);
  if (0 < this->numCol) {
    puts("   Var    Col          Flag   Move");
  }
  if (0 < this->numCol) {
    uVar4 = 0;
    do {
      uVar1 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4];
      if (uVar1 == 0) {
        printf("%6d %6d %6d\n",uVar4 & 0xffffffff,uVar4 & 0xffffffff);
      }
      else {
        printf("%6d %6d        %6d %6d\n",uVar4 & 0xffffffff,uVar4 & 0xffffffff,(ulong)uVar1,
               (ulong)(uint)(this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar4]);
      }
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)this->numCol);
  }
  if (0 < this->numRow) {
    puts("   Var    Row  Basic   Flag   Move");
  }
  if (0 < this->numRow) {
    uVar4 = 0;
    do {
      lVar3 = (uint)this->numCol + uVar4;
      lVar2 = (long)this->numCol + uVar4;
      uVar1 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar2];
      if (uVar1 == 0) {
        printf("%6d %6d %6d %6d\n",lVar3,uVar4 & 0xffffffff,
               (ulong)(uint)(this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_start[uVar4]);
      }
      else {
        printf("%6d %6d %6d %6d %6d\n",lVar3,uVar4 & 0xffffffff,
               (ulong)(uint)(this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_start[uVar4],(ulong)uVar1,
               (ulong)(uint)(this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar2]);
      }
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)this->numRow);
  }
  return;
}

Assistant:

void HModel::rp_basis() {
  printf("\nReporting current basis: numCol = %d; numRow = %d\n", numCol, numRow);
  if (numCol>0) printf("   Var    Col          Flag   Move\n");
  for (int col=0; col < numCol; col++) {
    int var = col;
    if (nonbasicFlag[var])
      printf("%6d %6d        %6d %6d\n", var, col, nonbasicFlag[var], nonbasicMove[var]);
    else
      printf("%6d %6d %6d\n", var, col, nonbasicFlag[var]);
  }
  if (numRow>0) printf("   Var    Row  Basic   Flag   Move\n");
  for (int row=0; row < numRow; row++) {
    int var = numCol+row;
    if (nonbasicFlag[var])
      printf("%6d %6d %6d %6d %6d\n", var, row, basicIndex[row], nonbasicFlag[var], nonbasicMove[var]);
    else
      printf("%6d %6d %6d %6d\n", var, row, basicIndex[row], nonbasicFlag[var]);
  }
}